

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::makeSequentialDebugType
          (Builder *this,Id baseType,Id componentCount,
          NonSemanticShaderDebugInfo100Instructions sequenceType)

{
  int iVar1;
  NonSemanticShaderDebugInfo100Instructions NVar2;
  Id IVar3;
  Id IVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  reference ppIVar7;
  Instruction *pIVar8;
  mapped_type_conflict *pmVar9;
  value_type local_48;
  NonSemanticShaderDebugInfo100Instructions local_40;
  NonSemanticShaderDebugInfo100Instructions local_3c;
  NonSemanticShaderDebugInfo100Instructions local_38;
  int local_34;
  Instruction *pIStack_30;
  int t;
  Instruction *type;
  Id local_20;
  NonSemanticShaderDebugInfo100Instructions sequenceType_local;
  Id componentCount_local;
  Id baseType_local;
  Builder *this_local;
  
  type._4_4_ = sequenceType;
  local_20 = componentCount;
  sequenceType_local = baseType;
  _componentCount_local = this;
  if (sequenceType != NonSemanticShaderDebugInfo100DebugTypeArray &&
      sequenceType != NonSemanticShaderDebugInfo100DebugTypeVector) {
    __assert_fail("sequenceType == NonSemanticShaderDebugInfo100DebugTypeArray || sequenceType == NonSemanticShaderDebugInfo100DebugTypeVector"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                  ,0x3b9,
                  "Id spv::Builder::makeSequentialDebugType(const Id, const Id, const NonSemanticShaderDebugInfo100Instructions)"
                 );
  }
  local_34 = 0;
  do {
    iVar1 = local_34;
    local_38 = type._4_4_;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,&local_38);
    sVar6 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size(pmVar5);
    if ((int)sVar6 <= iVar1) {
      pIVar8 = (Instruction *)::operator_new(0x60);
      IVar3 = getUniqueId(this);
      IVar4 = makeVoidType(this);
      spv::Instruction::Instruction(pIVar8,IVar3,IVar4,OpExtInst);
      pIStack_30 = pIVar8;
      spv::Instruction::reserveOperands(pIVar8,4);
      spv::Instruction::addIdOperand(pIStack_30,this->nonSemanticShaderDebugInfo);
      spv::Instruction::addImmediateOperand(pIStack_30,type._4_4_);
      pIVar8 = pIStack_30;
      pmVar9 = std::
               map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->debugId,&sequenceType_local);
      spv::Instruction::addIdOperand(pIVar8,*pmVar9);
      spv::Instruction::addIdOperand(pIStack_30,local_20);
      local_40 = type._4_4_;
      pmVar5 = std::
               unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
               ::operator[](&this->groupedDebugTypes,&local_40);
      std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
                (pmVar5,&stack0xffffffffffffffd0);
      std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
      unique_ptr<std::default_delete<spv::Instruction>,void>
                ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_48,
                 pIStack_30);
      std::
      vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
      ::push_back(&this->constantsTypesGlobals,&local_48);
      std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
                (&local_48);
      Module::mapInstruction(&this->module,pIStack_30);
      IVar3 = spv::Instruction::getResultId(pIStack_30);
      return IVar3;
    }
    local_3c = type._4_4_;
    pmVar5 = std::
             unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
             ::operator[](&this->groupedDebugTypes,&local_3c);
    ppIVar7 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (pmVar5,(long)local_34);
    pIStack_30 = *ppIVar7;
    NVar2 = spv::Instruction::getIdOperand(pIStack_30,0);
    if (NVar2 == sequenceType_local) {
      IVar3 = spv::Instruction::getIdOperand(pIStack_30,1);
      IVar4 = makeUintConstant(this,local_20,false);
      if (IVar3 == IVar4) {
        IVar3 = spv::Instruction::getResultId(pIStack_30);
        return IVar3;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Id Builder::makeSequentialDebugType(Id const baseType, Id const componentCount, NonSemanticShaderDebugInfo100Instructions const sequenceType)
{
    assert(sequenceType == NonSemanticShaderDebugInfo100DebugTypeArray ||
        sequenceType == NonSemanticShaderDebugInfo100DebugTypeVector);

    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedDebugTypes[sequenceType].size(); ++t) {
        type = groupedDebugTypes[sequenceType][t];
        if (type->getIdOperand(0) == baseType &&
            type->getIdOperand(1) == makeUintConstant(componentCount))
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    type->reserveOperands(4);
    type->addIdOperand(nonSemanticShaderDebugInfo);
    type->addImmediateOperand(sequenceType);
    type->addIdOperand(debugId[baseType]); // base type
    type->addIdOperand(componentCount); // component count

    groupedDebugTypes[sequenceType].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    return type->getResultId();
}